

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void SetCursorPosYAndSetupDummyPrevLine(float pos_y,float line_height)

{
  float fVar1;
  float fVar2;
  ImGuiWindow *pIVar3;
  ImGuiColumns *pIVar4;
  ImGuiTable *table;
  ImGuiContext *pIVar5;
  uint uVar6;
  
  pIVar5 = GImGui;
  pIVar3 = GImGui->CurrentWindow;
  fVar1 = (pIVar3->DC).CursorPos.y;
  (pIVar3->DC).CursorPos.y = pos_y;
  fVar2 = (pIVar3->DC).CursorMaxPos.y;
  uVar6 = -(uint)(pos_y <= fVar2);
  (pIVar3->DC).CursorMaxPos.y = (float)(~uVar6 & (uint)pos_y | (uint)fVar2 & uVar6);
  (pIVar3->DC).CursorPosPrevLine.y = pos_y - line_height;
  (pIVar3->DC).PrevLineSize.y = line_height - (pIVar5->Style).ItemSpacing.y;
  pIVar4 = (pIVar3->DC).CurrentColumns;
  if (pIVar4 != (ImGuiColumns *)0x0) {
    pIVar4->LineMinY = pos_y;
  }
  table = pIVar5->CurrentTable;
  if (table != (ImGuiTable *)0x0) {
    if (table->IsInsideRow == true) {
      ImGui::TableEndRow(table);
    }
    table->RowPosY2 = (pIVar3->DC).CursorPos.y;
    table->RowBgColorCounter = table->RowBgColorCounter + (int)((pos_y - fVar1) / line_height + 0.5)
    ;
  }
  return;
}

Assistant:

static void SetCursorPosYAndSetupDummyPrevLine(float pos_y, float line_height)
{
    // Set cursor position and a few other things so that SetScrollHereY() and Columns() can work when seeking cursor.
    // FIXME: It is problematic that we have to do that here, because custom/equivalent end-user code would stumble on the same issue.
    // The clipper should probably have a 4th step to display the last item in a regular manner.
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    float off_y = pos_y - window->DC.CursorPos.y;
    window->DC.CursorPos.y = pos_y;
    window->DC.CursorMaxPos.y = ImMax(window->DC.CursorMaxPos.y, pos_y);
    window->DC.CursorPosPrevLine.y = window->DC.CursorPos.y - line_height;  // Setting those fields so that SetScrollHereY() can properly function after the end of our clipper usage.
    window->DC.PrevLineSize.y = (line_height - g.Style.ItemSpacing.y);      // If we end up needing more accurate data (to e.g. use SameLine) we may as well make the clipper have a fourth step to let user process and display the last item in their list.
    if (ImGuiColumns* columns = window->DC.CurrentColumns)
        columns->LineMinY = window->DC.CursorPos.y;                         // Setting this so that cell Y position are set properly // FIXME-TABLE
    if (ImGuiTable* table = g.CurrentTable)
    {
        if (table->IsInsideRow)
            ImGui::TableEndRow(table);
        table->RowPosY2 = window->DC.CursorPos.y;
        table->RowBgColorCounter += (int)((off_y / line_height) + 0.5f);
    }
}